

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_Surface::IsCone(ON_Surface *this,ON_Cone *cone,double tolerance)

{
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  ON_3dPoint P_03;
  ON_3dPoint P_04;
  ON_3dPoint p_01;
  bool bVar1;
  int iVar2;
  ON_RevSurface *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar4;
  double dVar5;
  double dVar6;
  ON_RevSurface *local_4c0;
  ON_RevSurface *local_4a8;
  ON_RevSurface *local_468;
  ON_RevSurface *local_450;
  ON_3dPoint local_420;
  double local_408;
  double dStack_400;
  double local_3f8;
  ON_3dPoint local_3f0;
  uint local_3d8;
  int local_3d4;
  int jj;
  int j;
  int ii;
  int i;
  double *t;
  double *s;
  int sc1;
  int sc0;
  double r;
  double v;
  double u;
  ON_3dPoint P;
  double h;
  ON_3dPoint local_320;
  undefined1 auStack_308 [8];
  ON_Cone cn;
  ON_RevSurface *local_270;
  double tol;
  double h1;
  double h0;
  ON_3dPoint local_208;
  double local_1f0;
  double r1;
  double dStack_1e0;
  double local_1d8;
  ON_3dPoint local_1c8;
  double local_1b0;
  double r0;
  double local_1a0;
  double local_198;
  ON_3dPoint local_190;
  ON_Interval local_178;
  undefined4 local_164;
  ON_3dPoint local_160;
  ON_3dPoint local_148;
  uint local_12c;
  uint local_128;
  int bIsArc;
  int bIsLine;
  undefined1 auStack_118 [8];
  ON_Line line;
  undefined1 auStack_e0 [8];
  ON_Arc arc;
  ON_Curve *crv;
  ON_RevSurface *rs;
  double tolerance_local;
  ON_Cone *cone_local;
  ON_Surface *this_local;
  ON_Curve *pOVar3;
  
  bVar1 = ON_IsValid(tolerance);
  if ((!bVar1) || (rs = (ON_RevSurface *)tolerance, tolerance <= 0.0)) {
    rs = (ON_RevSurface *)0x3df0000000000000;
  }
  this_00 = ON_RevSurface::Cast((ON_Object *)this);
  if (this_00 == (ON_RevSurface *)0x0) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
    ON_Interval::Mid((ON_Interval *)(arc.m_angle.m_t + 1));
    iVar2 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(this,0);
    pOVar3 = (ON_Curve *)CONCAT44(extraout_var,iVar2);
    if (pOVar3 == (ON_Curve *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      ON_Arc::ON_Arc((ON_Arc *)auStack_e0);
      ON_Line::ON_Line((ON_Line *)auStack_118);
      local_128 = 0;
      dVar4 = 2.3283064365386963e-10;
      if ((double)rs <= 2.3283064365386963e-10) {
        local_450 = (ON_RevSurface *)0x0;
      }
      else {
        local_450 = rs;
      }
      iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                        (local_450,pOVar3,0,auStack_e0);
      local_12c = (uint)((byte)iVar2 & 1);
      if (local_12c == 0) {
        dVar4 = 2.3283064365386963e-10;
        if ((double)rs <= 2.3283064365386963e-10) {
          local_468 = (ON_RevSurface *)0x0;
        }
        else {
          local_468 = rs;
        }
        iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(local_468);
        local_128 = (uint)((byte)iVar2 & 1);
        if (local_128 != 0) {
          ON_Curve::PointAtStart(&local_148,pOVar3);
          line.from.y = local_148.z;
          auStack_118 = (undefined1  [8])local_148.x;
          line.from.x = local_148.y;
          ON_Curve::PointAtEnd(&local_160,pOVar3);
          line.from.z = local_160.x;
          line.to.x = local_160.y;
          line.to.y = local_160.z;
        }
      }
      if (pOVar3 != (ON_Curve *)0x0) {
        (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      if ((local_12c == 0) && (local_128 == 0)) {
        this_local._7_1_ = false;
        local_164 = 1;
      }
      else {
        (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
        local_178.m_t[1] = dVar4;
        dVar4 = ON_Interval::Mid(&local_178);
        iVar2 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(dVar4,this,1);
        pOVar3 = (ON_Curve *)CONCAT44(extraout_var_00,iVar2);
        if (pOVar3 == (ON_Curve *)0x0) {
          this_local._7_1_ = false;
          local_164 = 1;
        }
        else {
          if (local_12c == 0) {
            if ((double)rs <= 2.3283064365386963e-10) {
              local_4a8 = (ON_RevSurface *)0x0;
            }
            else {
              local_4a8 = rs;
            }
            iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x30])
                              (local_4a8,pOVar3,0,auStack_e0);
            local_12c = (uint)((byte)iVar2 & 1);
          }
          else if (local_128 == 0) {
            if ((double)rs <= 2.3283064365386963e-10) {
              local_4c0 = (ON_RevSurface *)0x0;
            }
            else {
              local_4c0 = rs;
            }
            iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])(local_4c0);
            local_128 = (uint)((byte)iVar2 & 1);
            if (local_128 != 0) {
              ON_Curve::PointAtStart(&local_190,pOVar3);
              line.from.y = local_190.z;
              auStack_118 = (undefined1  [8])local_190.x;
              line.from.x = local_190.y;
              ON_Curve::PointAtEnd((ON_3dPoint *)&r0,pOVar3);
              line.from.z = r0;
              line.to.x = local_1a0;
              line.to.y = local_198;
            }
          }
          if (pOVar3 != (ON_Curve *)0x0) {
            (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
          }
          if ((local_12c == 0) || (local_128 == 0)) {
            this_local._7_1_ = false;
            local_164 = 1;
          }
          else {
            local_1d8 = line.from.y;
            r1 = (double)auStack_118;
            dStack_1e0 = line.from.x;
            p.y = line.from.x;
            p.x = (double)auStack_118;
            p.z = line.from.y;
            ON_Plane::ClosestPointTo(&local_1c8,(ON_Plane *)auStack_e0,p);
            local_1b0 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_e0,&local_1c8);
            p_00.y = line.to.x;
            p_00.x = line.from.z;
            p_00.z = line.to.y;
            ON_Plane::ClosestPointTo(&local_208,(ON_Plane *)auStack_e0,p_00);
            local_1f0 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_e0,&local_208);
            if (2.3283064365386963e-10 < ABS(local_1b0 - local_1f0)) {
              P_00.y = line.from.x;
              P_00.x = (double)auStack_118;
              P_00.z = line.from.y;
              dVar5 = ON_PlaneEquation::ValueAt
                                ((ON_PlaneEquation *)&arc.super_ON_Circle.plane.zaxis.z,P_00);
              P_01.y = line.to.x;
              P_01.x = line.from.z;
              P_01.z = line.to.y;
              dVar4 = ON_PlaneEquation::ValueAt
                                ((ON_PlaneEquation *)&arc.super_ON_Circle.plane.zaxis.z,P_01);
              if (2.3283064365386963e-10 < ABS(dVar5 - dVar4)) {
                dVar6 = local_1b0 + local_1f0;
                ON_Cone::ON_Cone((ON_Cone *)auStack_308);
                cn.plane.plane_equation.d =
                     (dVar5 * local_1f0 - local_1b0 * dVar4) / (local_1f0 - local_1b0);
                bVar1 = ON_IsValid(cn.plane.plane_equation.d);
                if ((!bVar1) || (ABS(cn.plane.plane_equation.d) <= 2.3283064365386963e-10)) {
                  this_local._7_1_ = false;
                }
                else {
                  cn.plane.plane_equation.y = arc.super_ON_Circle.plane.plane_equation.y;
                  cn.plane.plane_equation.z = arc.super_ON_Circle.plane.plane_equation.z;
                  cn.plane.zaxis.z = arc.super_ON_Circle.plane.zaxis.z;
                  cn.plane.plane_equation.x = arc.super_ON_Circle.plane.plane_equation.x;
                  cn.plane.zaxis.x = arc.super_ON_Circle.plane.zaxis.x;
                  cn.plane.zaxis.y = arc.super_ON_Circle.plane.zaxis.y;
                  cn.plane.yaxis.y = arc.super_ON_Circle.plane.yaxis.y;
                  cn.plane.yaxis.z = arc.super_ON_Circle.plane.yaxis.z;
                  cn.plane.xaxis.z = arc.super_ON_Circle.plane.xaxis.z;
                  cn.plane.yaxis.x = arc.super_ON_Circle.plane.yaxis.x;
                  cn.plane.xaxis.x = arc.super_ON_Circle.plane.xaxis.x;
                  cn.plane.xaxis.y = arc.super_ON_Circle.plane.xaxis.y;
                  cn.plane.origin.y = arc.super_ON_Circle.plane.origin.y;
                  cn.plane.origin.z = arc.super_ON_Circle.plane.origin.z;
                  auStack_308 = auStack_e0;
                  cn.plane.origin.x = arc.super_ON_Circle.plane.origin.x;
                  ::operator*((ON_3dVector *)&h,cn.plane.plane_equation.d,
                              (ON_3dVector *)&cn.plane.yaxis.z);
                  ON_3dPoint::operator+(&local_320,(ON_3dPoint *)auStack_308,(ON_3dVector *)&h);
                  cn.plane.origin.y = local_320.z;
                  auStack_308 = (undefined1  [8])local_320.x;
                  cn.plane.origin.x = local_320.y;
                  ON_Plane::UpdateEquation((ON_Plane *)auStack_308);
                  if (local_1b0 < local_1f0) {
                    cn.height = local_1f0;
                  }
                  else {
                    cn.height = local_1b0;
                    dVar4 = dVar5;
                  }
                  cn.plane.plane_equation.d = dVar4 - cn.plane.plane_equation.d;
                  bVar1 = ON_Cone::IsValid((ON_Cone *)auStack_308);
                  if (bVar1) {
                    dVar4 = dVar6 * 7.450580596925e-09 * ABS(cn.plane.plane_equation.d);
                    P_02.y = line.from.x;
                    P_02.x = (double)auStack_118;
                    P_02.z = line.from.y;
                    dVar5 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&cn.plane.zaxis.z,P_02);
                    if (ABS(local_1b0 * cn.plane.plane_equation.d + -(dVar5 * cn.height)) <= dVar4)
                    {
                      P_03.y = line.to.x;
                      P_03.x = line.from.z;
                      P_03.z = line.to.y;
                      dVar5 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&cn.plane.zaxis.z,P_03);
                      if (ABS(local_1f0 * cn.plane.plane_equation.d + -(dVar5 * cn.height)) <= dVar4
                         ) {
                        s._4_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                                            (this,0);
                        s._0_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                                            (this,1);
                        t = (double *)onmalloc((long)(s._4_4_ + (int)s) * 8 + 0x10);
                        _ii = t + (long)s._4_4_ + 1;
                        (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,t)
                        ;
                        (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])
                                  (this,1,_ii);
                        local_270 = (ON_RevSurface *)((local_1b0 + local_1f0) * 7.450580596925e-09);
                        if ((double)local_270 < (double)rs) {
                          local_270 = rs;
                        }
                        dVar4 = ABS(cn.plane.plane_equation.d);
                        for (j = 0; j < s._4_4_; j = j + 1) {
                          for (jj = (int)(j != 0); jj < 5; jj = jj + 1) {
                            v = ((double)(4 - jj) * t[j] + (double)jj * t[j + 1]) * 0.25;
                            for (local_3d4 = 0; local_3d4 < (int)s; local_3d4 = local_3d4 + 1) {
                              for (local_3d8 = (uint)(local_3d4 != 0); (int)local_3d8 < 5;
                                  local_3d8 = local_3d8 + 1) {
                                r = ((double)(int)(4 - local_3d8) * _ii[local_3d4] +
                                    (double)(int)local_3d8 * _ii[(long)local_3d4 + 1]) * 0.25;
                                PointAt(&local_3f0,this,v,r);
                                P.y = local_3f0.z;
                                u = local_3f0.x;
                                P.x = local_3f0.y;
                                local_3f8 = local_3f0.z;
                                local_408 = local_3f0.x;
                                dStack_400 = local_3f0.y;
                                P_04.y = local_3f0.y;
                                P_04.x = local_3f0.x;
                                P_04.z = local_3f0.z;
                                dVar5 = ON_PlaneEquation::ValueAt
                                                  ((ON_PlaneEquation *)&cn.plane.zaxis.z,P_04);
                                p_01.y = P.x;
                                p_01.x = u;
                                p_01.z = P.y;
                                ON_Plane::ClosestPointTo(&local_420,(ON_Plane *)auStack_308,p_01);
                                _sc1 = ON_3dPoint::DistanceTo((ON_3dPoint *)auStack_308,&local_420);
                                if (dVar4 * (double)local_270 <
                                    ABS(_sc1 * cn.plane.plane_equation.d + -(dVar5 * cn.height))) {
                                  onfree(t);
                                  this_local._7_1_ = false;
                                  goto LAB_0082a336;
                                }
                              }
                            }
                          }
                        }
                        onfree(t);
                        if (cone != (ON_Cone *)0x0) {
                          memcpy(cone,auStack_308,0x90);
                        }
                        this_local._7_1_ = true;
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
LAB_0082a336:
                local_164 = 1;
                ON_Cone::~ON_Cone((ON_Cone *)auStack_308);
              }
              else {
                this_local._7_1_ = false;
                local_164 = 1;
              }
            }
            else {
              this_local._7_1_ = false;
              local_164 = 1;
            }
          }
        }
      }
      ON_Line::~ON_Line((ON_Line *)auStack_118);
      ON_Arc::~ON_Arc((ON_Arc *)auStack_e0);
    }
  }
  else {
    bVar1 = ON_RevSurface::IsConical(this_00,cone,(double)rs);
    this_local._7_1_ = (bool)(-bVar1 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Surface::IsCone( ON_Cone* cone, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsConical(cone,tolerance) ? true : false;
  }


  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc;
  ON_Line line;
  int bIsLine = 0;
  int bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  if ( !bIsArc )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc && !bIsLine )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  if ( !bIsArc )
    bIsArc = crv->IsArc(0,&arc,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  else if ( !bIsLine )
  {
    bIsLine = crv->IsLinear(tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
    if ( bIsLine )
    {
      line.from = crv->PointAtStart();
      line.to = crv->PointAtEnd();
    }
  }
  delete crv;
  crv = 0;
  if ( !bIsArc || !bIsLine )
    return false;

  double r0 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.from));
  double r1 = arc.plane.origin.DistanceTo(arc.plane.ClosestPointTo(line.to));
  if ( fabs(r0-r1) <= ON_ZERO_TOLERANCE )
    return false;
  double h0 = arc.plane.plane_equation.ValueAt(line.from);
  double h1 = arc.plane.plane_equation.ValueAt(line.to);
  if ( fabs(h0-h1) <= ON_ZERO_TOLERANCE )
    return false;
  double tol = 0.5*ON_SQRT_EPSILON*(r0+r1);

  ON_Cone cn;
  cn.height = (h0*r1 - r0*h1)/(r1-r0);
  if ( !ON_IsValid(cn.height) || fabs(cn.height) <= ON_ZERO_TOLERANCE )
    return false;
  cn.plane = arc.plane;
  cn.plane.origin = cn.plane.origin + cn.height*cn.plane.zaxis;
  cn.plane.UpdateEquation();
  if ( r0 >= r1 )
  {
    cn.radius = r0;
    cn.height = h0-cn.height;
  }
  else
  {
    cn.radius = r1;
    cn.height = h1-cn.height;
  }
  if ( !cn.IsValid() )
    return false;
  tol *= fabs(cn.height);

  // if (r - h*cn.radius/cn.height > tolerance) return false;
  double h = cn.plane.plane_equation.ValueAt(line.from);
  if ( fabs(r0*cn.height - h*cn.radius) > tol )
    return false;
  h = cn.plane.plane_equation.ValueAt(line.to);
  if ( fabs(r1*cn.height - h*cn.radius) > tol )
    return false;

  ON_3dPoint P;
  double u, v, r;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  tol = 0.5*ON_SQRT_EPSILON*(r0+r1);
  if ( tol < tolerance )
    tol = tolerance;
  tol *= fabs(cn.height);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          h = cn.plane.plane_equation.ValueAt(P);
          r = cn.plane.origin.DistanceTo(cn.plane.ClosestPointTo(P));
          // if (r - h*cn.radius/cn.height > tolerance) return false;
          if ( fabs(r*cn.height - h*cn.radius) > tol )
          {
            onfree(s);
            return false;
          }
        }
      }
    }
  }
  onfree(s);

  if ( cone )
  {
    *cone = cn;
  }

  return true;
}